

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
          (RefPtr<wabt::interp::Extern> *this,Store *store,Ref ref)

{
  FILE *__stream;
  bool bVar1;
  Object **ppOVar2;
  char *pcVar3;
  char *pcVar4;
  Index IVar5;
  ObjectKind local_2c;
  ObjectKind ref_kind;
  Store *store_local;
  RefPtr<wabt::interp::Extern> *this_local;
  Ref ref_local;
  
  bVar1 = Store::Is<wabt::interp::Extern>(store,ref);
  if (!bVar1) {
    bVar1 = interp::operator==(ref,Ref::Null);
    if (bVar1) {
      local_2c = First;
    }
    else {
      ppOVar2 = FreeList<wabt::interp::Object_*>::Get(&store->objects_,ref.index);
      local_2c = Object::kind(*ppOVar2);
    }
    __stream = _stderr;
    pcVar3 = GetName(local_2c);
    pcVar4 = Extern::GetTypeName();
    fprintf(__stream,"Invalid conversion from Ref (%s) to RefPtr<%s>!\n",pcVar3,pcVar4);
    abort();
  }
  IVar5 = Store::NewRoot(store,ref);
  this->root_index_ = IVar5;
  ppOVar2 = FreeList<wabt::interp::Object_*>::Get(&store->objects_,ref.index);
  this->obj_ = (Extern *)*ppOVar2;
  this->store_ = store;
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}